

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O0

uint8_t * bstr_while_predicate(uint8_t *pBegin,uint8_t *pEnd,_func_int_int *pred_func)

{
  int iVar1;
  uint8_t *puStack_28;
  int c;
  uint8_t *pNext;
  _func_int_int *pred_func_local;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  
  puStack_28 = pBegin;
  while ((puStack_28 < pEnd && (iVar1 = (*pred_func)((int)*puStack_28), iVar1 != 0))) {
    puStack_28 = puStack_28 + 1;
  }
  return puStack_28;
}

Assistant:

const uint8_t *bstr_while_predicate(const uint8_t *pBegin, const uint8_t *pEnd, int (*pred_func)(int c) )
{
   const uint8_t *pNext = pBegin;
   while (pNext < pEnd)
   {
      int c = (int) *pNext;
      if (!pred_func(c)){
         break;
      }
      pNext++;
   }
   return pNext;
}